

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * ODDLParser::OpenDDLParser::parsePrimitiveDataType
                 (char *in,char *end,ValueType *type,size_t *len)

{
  char cVar1;
  int iVar2;
  size_t __n;
  char *pcVar3;
  char *pcVar4;
  char *__nptr;
  undefined **ppuVar5;
  long lVar6;
  
  *type = ddl_none;
  *len = 0;
  pcVar4 = in;
  if (in != end && in != (char *)0x0) {
    ppuVar5 = &Grammar::PrimitiveTypeToken;
    lVar6 = 0;
    do {
      pcVar4 = *ppuVar5;
      __n = strlen(pcVar4);
      iVar2 = strncmp(in,pcVar4,__n);
      if (iVar2 == 0) {
        *type = (ValueType)lVar6;
        goto LAB_0068e458;
      }
      lVar6 = lVar6 + 1;
      ppuVar5 = ppuVar5 + 1;
    } while (lVar6 != 0xe);
    if (*type == ddl_none) {
      do {
        if (0x2c < (ulong)(byte)*in) {
          return (char *)(byte *)in;
        }
        if ((0x100100002600U >> ((ulong)(byte)*in & 0x3f) & 1) == 0) {
          return (char *)(byte *)in;
        }
        in = (char *)((byte *)in + 1);
        pcVar4 = end;
      } while (in != end);
    }
    else {
LAB_0068e458:
      pcVar4 = in + __n;
      if (in[__n] == '[') {
        __nptr = pcVar4 + 1;
        pcVar3 = in + __n + 2;
        do {
          if (pcVar3 + -1 == end) {
            *type = ddl_none;
            return end;
          }
          pcVar4 = pcVar3 + 1;
          cVar1 = *pcVar3;
          pcVar3 = pcVar4;
        } while (cVar1 != ']');
        iVar2 = atoi(__nptr);
        *len = (long)iVar2;
      }
      else {
        *len = 1;
      }
    }
  }
  return pcVar4;
}

Assistant:

char *OpenDDLParser::parsePrimitiveDataType( char *in, char *end, Value::ValueType &type, size_t &len ) {
    type = Value::ddl_none;
    len = 0;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    size_t prim_len( 0 );
    for( unsigned int i = 0; i < Value::ddl_types_max; i++ ) {
        prim_len = strlen( Grammar::PrimitiveTypeToken[ i ] );
        if( 0 == strncmp( in, Grammar::PrimitiveTypeToken[ i ], prim_len ) ) {
            type = static_cast<Value::ValueType>( i );
            break;
        }
    }

    if( Value::ddl_none == type ) {
        in = lookForNextToken( in, end );
        return in;
    } else {
        in += prim_len;
    }

    bool ok( true );
    if( *in == Grammar::OpenArrayToken[ 0 ] ) {
        ok = false;
        ++in;
        char *start( in );
        while ( in != end ) {
            ++in;
            if( *in == Grammar::CloseArrayToken[ 0 ] ) {
                len = ::atoi( start );
                ok = true;
                ++in;
                break;
            }
        }
    } else {
        len = 1;
    }
    if( !ok ) {
        type = Value::ddl_none;
    }

    return in;
}